

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlDebugDumpOneNode(void)

{
  int iVar1;
  int iVar2;
  FILE *val;
  xmlNodePtr val_00;
  int local_34;
  int n_depth;
  int depth;
  int n_node;
  xmlNodePtr node;
  int n_output;
  FILE *output;
  int mem_base;
  int test_ret;
  
  output._4_4_ = 0;
  for (node._4_4_ = 0; (int)node._4_4_ < 2; node._4_4_ = node._4_4_ + 1) {
    for (n_depth = 0; n_depth < 3; n_depth = n_depth + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_debug_FILE_ptr(node._4_4_,0);
        val_00 = gen_xmlNodePtr(n_depth,1);
        iVar2 = gen_int(local_34,2);
        xmlDebugDumpOneNode(val,val_00,iVar2);
        call_tests = call_tests + 1;
        des_debug_FILE_ptr(node._4_4_,val,0);
        des_xmlNodePtr(n_depth,val_00,1);
        des_int(local_34,iVar2,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpOneNode",(ulong)(uint)(iVar2 - iVar1));
          output._4_4_ = output._4_4_ + 1;
          printf(" %d",(ulong)node._4_4_);
          printf(" %d",(ulong)(uint)n_depth);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return output._4_4_;
}

Assistant:

static int
test_xmlDebugDumpOneNode(void) {
    int test_ret = 0;

#if defined(LIBXML_DEBUG_ENABLED)
    int mem_base;
    FILE * output; /* the FILE * for the output */
    int n_output;
    xmlNodePtr node; /* the node */
    int n_node;
    int depth; /* the indentation level. */
    int n_depth;

    for (n_output = 0;n_output < gen_nb_debug_FILE_ptr;n_output++) {
    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_depth = 0;n_depth < gen_nb_int;n_depth++) {
        mem_base = xmlMemBlocks();
        output = gen_debug_FILE_ptr(n_output, 0);
        node = gen_xmlNodePtr(n_node, 1);
        depth = gen_int(n_depth, 2);

        xmlDebugDumpOneNode(output, node, depth);
        call_tests++;
        des_debug_FILE_ptr(n_output, output, 0);
        des_xmlNodePtr(n_node, node, 1);
        des_int(n_depth, depth, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlDebugDumpOneNode",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_output);
            printf(" %d", n_node);
            printf(" %d", n_depth);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}